

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidLayerNormalizationNoNormalizedShape(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  Arena *pAVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  WeightParams *pWVar7;
  string *psVar8;
  long lVar9;
  ostream *poVar10;
  undefined1 local_d0 [8];
  Result res;
  LayerNormalizationLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"input",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"output",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,2);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  res.m_message.field_2._8_8_ =
       CoreML::Specification::NeuralNetworkLayer::mutable_layernormalization(this_00);
  pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                     ((LayerNormalizationLayerParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
  pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta
                     ((LayerNormalizationLayerParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,0.0);
  CoreML::validate<(MLModelType)500>((Result *)local_d0,(Model *)&in);
  bVar1 = CoreML::Result::good((Result *)local_d0);
  if (bVar1) {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x16bc);
    poVar10 = std::operator<<(poVar10,": error: ");
    poVar10 = std::operator<<(poVar10,"!((res).good())");
    poVar10 = std::operator<<(poVar10," was false, expected true.");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    psVar8 = CoreML::Result::message_abi_cxx11_((Result *)local_d0);
    lVar9 = std::__cxx11::string::find((char *)psVar8,0x554084);
    if (lVar9 == -1) {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x16bd);
      poVar10 = std::operator<<(poVar10,": error: ");
      poVar10 = std::operator<<(poVar10,
                                "res.message().find(\"Normalized shape\") != std::string::npos");
      poVar10 = std::operator<<(poVar10," was false, expected true.");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      m._oneof_case_[0] = 0;
    }
  }
  CoreML::Result::~Result((Result *)local_d0);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidLayerNormalizationNoNormalizedShape() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(0.0);

    // not specifying the value for normalized shape
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("Normalized shape") != std::string::npos);

    return 0;

}